

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateArgMaxLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  string *this_00;
  ActivationLinear *pAVar1;
  bool bVar2;
  Type *pTVar3;
  long lVar4;
  Result *_result;
  undefined1 *puVar5;
  string err;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar2 = Result::good(__return_storage_ptr__);
  if (bVar2) {
    this_00 = &__return_storage_ptr__->m_message;
    std::__cxx11::string::~string((string *)this_00);
    validateOutputCount(__return_storage_ptr__,layer,1,1);
    bVar2 = Result::good(__return_storage_ptr__);
    if (bVar2) {
      std::__cxx11::string::~string((string *)this_00);
      if (layer->_oneof_case_[0] == 0x401) {
        puVar5 = *(undefined1 **)&layer->layer_;
      }
      else {
        puVar5 = Specification::_ArgMaxLayerParams_default_instance_;
      }
      if (((ConcatNDLayerParams *)puVar5)->interleave_ == false) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_60,"ArgMax",(allocator<char> *)&err);
        validateInputOutputRankEquality
                  (__return_storage_ptr__,layer,&local_60,&this->blobNameToRank);
        std::__cxx11::string::~string((string *)&local_60);
        bVar2 = Result::good(__return_storage_ptr__);
        if (!bVar2) {
          return __return_storage_ptr__;
        }
        std::__cxx11::string::~string((string *)this_00);
      }
      if (0 < (layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_) {
        if (layer->_oneof_case_[0] == 0x401) {
          puVar5 = *(undefined1 **)&layer->layer_;
        }
        else {
          puVar5 = Specification::_ArgMaxLayerParams_default_instance_;
        }
        pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                           (&(layer->inputtensor_).super_RepeatedPtrFieldBase,0);
        lVar4 = (long)(int)pTVar3->rank_;
        pAVar1 = (((ActivationParams *)puVar5)->NonlinearityType_).linear_;
        if ((SBORROW8((long)pAVar1,-lVar4) !=
             (long)&(pAVar1->super_MessageLite)._vptr_MessageLite + lVar4 < 0) ||
           (lVar4 <= (long)pAVar1)) {
          std::operator+(&local_40,
                         "Value of axis must be in the range [-rank(tensor), rank(tensor)) for \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
          std::operator+(&err,&local_40,"\' layer.");
          std::__cxx11::string::~string((string *)&local_40);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
          std::__cxx11::string::~string((string *)&err);
          return __return_storage_ptr__;
        }
      }
      Result::Result(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateArgMaxLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));
    if (!layer.argmax().removedim()) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "ArgMax", blobNameToRank));
    }
    if (layer.inputtensor_size() > 0) {
        const auto& params = layer.argmax();
        const int rank = static_cast<int>(layer.inputtensor(0).rank());
        if (params.axis() < -rank || params.axis() >= rank) {
            const std::string err = "Value of axis must be in the range [-rank(tensor), rank(tensor)) for '" + layer.name() + "' layer.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    return Result();
}